

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O3

bool duckdb::DoubleToDecimalCast<double,short>
               (double input,short *result,CastParameters *parameters,uint8_t width,uint8_t scale)

{
  double dVar1;
  bool bVar2;
  InvalidInputException *this;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  CastParameters *this_00;
  uchar in_R8B;
  double dVar3;
  double dVar4;
  string error;
  string local_68;
  Exception local_48;
  undefined1 local_38 [16];
  
  dVar3 = *(double *)
           (NumericHelper::DOUBLE_POWERS_OF_TEN +
           (CONCAT71(in_register_00000009,scale) & 0xffffffff) * 8) * input;
  this_00 = parameters;
  dVar4 = round(dVar3);
  dVar1 = *(double *)
           (NumericHelper::DOUBLE_POWERS_OF_TEN +
           (CONCAT71(in_register_00000011,width) & 0xffffffff) * 8);
  if (-dVar1 < dVar4 && dVar4 < dVar1) {
    bVar2 = Value::IsFinite<double>(dVar3);
    if (((!bVar2) || (dVar3 < -32768.0)) || (32768.0 <= dVar3)) {
      this = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<double,short>(&local_68,(duckdb *)this_00,dVar3);
      InvalidInputException::InvalidInputException(this,(string *)&local_68);
      __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    dVar3 = nearbyint(dVar3);
    *result = (short)(int)dVar3;
  }
  else {
    local_48._0_8_ = local_38;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Could not cast value %f to DECIMAL(%d,%d)","");
    Exception::ConstructMessage<double,unsigned_char,unsigned_char>
              (&local_68,&local_48,(string *)(ulong)width,input,scale,in_R8B);
    if ((undefined1 *)local_48._0_8_ != local_38) {
      operator_delete((void *)local_48._0_8_);
    }
    HandleCastError::AssignError(&local_68,parameters);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
  }
  return -dVar1 < dVar4 && dVar4 < dVar1;
}

Assistant:

bool DoubleToDecimalCast(SRC input, DST &result, CastParameters &parameters, uint8_t width, uint8_t scale) {
	double value = input * NumericHelper::DOUBLE_POWERS_OF_TEN[scale];
	double roundedValue = round(value);
	if (roundedValue <= -NumericHelper::DOUBLE_POWERS_OF_TEN[width] ||
	    roundedValue >= NumericHelper::DOUBLE_POWERS_OF_TEN[width]) {
		string error = StringUtil::Format("Could not cast value %f to DECIMAL(%d,%d)", input, width, scale);
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	result = Cast::Operation<SRC, DST>(static_cast<SRC>(value));
	return true;
}